

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O0

bool __thiscall Lodtalk::VMContext::isClassOrMetaclass(VMContext *this,Oop oop)

{
  int iVar1;
  Oop obj;
  Oop clazz;
  int classIndex;
  VMContext *this_local;
  Oop oop_local;
  
  iVar1 = classIndexOf(oop);
  if (iVar1 == 0xc) {
    oop_local.field_0.uintValue._7_1_ = 1;
  }
  else {
    iVar1 = classIndexOf(oop);
    obj = getClassFromIndex(this,iVar1);
    iVar1 = classIndexOf(obj);
    oop_local.field_0.uintValue._7_1_ = iVar1 == 0xc;
  }
  return (bool)oop_local.field_0.uintValue._7_1_;
}

Assistant:

bool VMContext::isClassOrMetaclass(Oop oop)
{
	auto classIndex = classIndexOf(oop);
	if(classIndex == SCI_Metaclass)
		return true;

	auto clazz = getClassFromIndex(classIndexOf(oop));
	return classIndexOf(clazz) == SCI_Metaclass;
}